

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void startDocumentTokenizer(void *ctx)

{
  int *piVar1;
  xmlTokenizerConfig *config;
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  piVar1 = *(int **)((long)ctx + 0x1a8);
  *(undefined4 *)((long)ctx + 0x110) = 7;
  if (*piVar1 != 0) {
    *(int *)((long)ctx + 0x2f0) = *piVar1;
    *(undefined8 *)((long)ctx + 0x120) = *(undefined8 *)(piVar1 + 2);
  }
  return;
}

Assistant:

static void
startDocumentTokenizer(void *ctx) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    ctxt->instate = XML_PARSER_CONTENT;

    if (config->dataState != 0) {
        ctxt->endCheckState = config->dataState;
        ctxt->name = config->startTag;
    }
}